

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O3

int libj1939_bind_socket(int sock,sockaddr_can *addr)

{
  int iVar1;
  int iVar2;
  undefined4 local_c;
  
  iVar1 = bind(sock,(sockaddr *)addr,0x18);
  iVar2 = 0;
  if (iVar1 < 0) {
    libj1939_bind_socket_cold_1();
    iVar2 = local_c;
  }
  return iVar2;
}

Assistant:

int libj1939_bind_socket(int sock, struct sockaddr_can *addr)
{
	int ret;

	ret = bind(sock, (void *)addr, sizeof(*addr));
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to bind: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}